

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

void accommodateAlienBasis(HighsLpSolverObject *solver_object)

{
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *pvVar1;
  uint uVar2;
  uint uVar3;
  HighsBasis *pHVar4;
  HighsOptions *pHVar5;
  pointer pHVar6;
  HighsInt HVar7;
  HighsInt iRow;
  uint num_basic;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *pvVar11;
  ulong uVar12;
  ulong uVar13;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *pvVar14;
  vector<int,_std::allocator<int>_> basic_index;
  HFactor factor;
  _Vector_base<int,_std::allocator<int>_> local_7c8;
  HighsLp *local_7b0;
  HFactor local_7a8;
  
  local_7b0 = solver_object->lp_;
  pHVar4 = solver_object->basis_;
  pHVar5 = solver_object->options_;
  uVar2 = local_7b0->num_col_;
  uVar3 = local_7b0->num_row_;
  local_7c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c8._M_impl.super__Vector_impl_data._M_start = (HighsInt *)0x0;
  local_7c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar1 = &pHVar4->col_status;
  for (local_7a8.build_realTick._0_4_ = 0; local_7a8.build_realTick._0_4_ < (int)uVar2;
      local_7a8.build_realTick._0_4_ = local_7a8.build_realTick._0_4_ + 1) {
    if ((pvVar1->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
        super__Vector_impl_data._M_start[local_7a8.build_realTick._0_4_] == kBasic) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_7c8,(value_type_conflict2 *)&local_7a8)
      ;
    }
  }
  pvVar14 = &pHVar4->row_status;
  uVar12 = 0;
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
    if ((pvVar14->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar12] == kBasic) {
      local_7a8.build_realTick._0_4_ = uVar2 + (int)uVar12;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_7c8,(int *)&local_7a8);
    }
  }
  uVar12 = (long)local_7c8._M_impl.super__Vector_impl_data._M_finish -
           (long)local_7c8._M_impl.super__Vector_impl_data._M_start;
  HFactor::HFactor(&local_7a8);
  num_basic = (uint)(uVar12 >> 2);
  HFactor::setupGeneral
            (&local_7a8,&local_7b0->a_matrix_,num_basic,
             local_7c8._M_impl.super__Vector_impl_data._M_start,0.1,1e-10,0,
             &(pHVar5->super_HighsOptionsStruct).log_options);
  uVar13 = 0;
  HVar7 = HFactor::build(&local_7a8,(HighsTimerClock *)0x0);
  uVar12 = 0;
  if (0 < (int)uVar2) {
    uVar12 = (ulong)uVar2;
  }
  for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
    pHVar6 = (pvVar1->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (pHVar6[uVar13] == kBasic) {
      pHVar6[uVar13] = kNonbasic;
    }
  }
  for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
    pHVar6 = (pvVar14->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (pHVar6[uVar12] == kBasic) {
      pHVar6[uVar12] = kNonbasic;
    }
  }
  if ((int)uVar3 < (int)num_basic) {
    num_basic = uVar3;
  }
  if ((int)num_basic < 1) {
    num_basic = 0;
  }
  for (lVar9 = 0; (ulong)num_basic * 4 - lVar9 != 0; lVar9 = lVar9 + 4) {
    pvVar11 = pvVar14;
    uVar10 = uVar2;
    if (*(int *)((long)local_7c8._M_impl.super__Vector_impl_data._M_start + lVar9) < (int)uVar2) {
      uVar10 = 0;
      pvVar11 = pvVar1;
    }
    (pvVar11->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
    super__Vector_impl_data._M_start
    [(int)(*(int *)((long)local_7c8._M_impl.super__Vector_impl_data._M_start + lVar9) - uVar10)] =
         kBasic;
  }
  uVar12 = 0;
  uVar8 = (ulong)(uVar3 - num_basic);
  if ((int)(uVar3 - num_basic) < 1) {
    uVar8 = uVar12;
  }
  for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
    (pvVar14->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
    super__Vector_impl_data._M_start
    [local_7a8.row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start[(long)HVar7 + uVar12]] = kBasic;
  }
  HFactor::~HFactor(&local_7a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_7c8);
  return;
}

Assistant:

void accommodateAlienBasis(HighsLpSolverObject& solver_object) {
  HighsLp& lp = solver_object.lp_;
  HighsBasis& basis = solver_object.basis_;
  HighsOptions& options = solver_object.options_;
  assert(basis.alien);
  HighsInt num_row = lp.num_row_;
  HighsInt num_col = lp.num_col_;
  assert((int)basis.col_status.size() >= num_col);
  assert((int)basis.row_status.size() >= num_row);
  std::vector<HighsInt> basic_index;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (basis.col_status[iCol] == HighsBasisStatus::kBasic)
      basic_index.push_back(iCol);
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (basis.row_status[iRow] == HighsBasisStatus::kBasic)
      basic_index.push_back(num_col + iRow);
  }
  HighsInt num_basic_variables = basic_index.size();
  HFactor factor;
  factor.setupGeneral(&lp.a_matrix_, num_basic_variables, basic_index.data(),
                      kDefaultPivotThreshold, kDefaultPivotTolerance,
                      kHighsDebugLevelMin, &options.log_options);
  HighsInt rank_deficiency = factor.build();
  // Must not have timed out
  assert(rank_deficiency >= 0);
  // Deduce the basis from basic_index
  //
  // Set all basic variables to nonbasic
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (basis.col_status[iCol] == HighsBasisStatus::kBasic)
      basis.col_status[iCol] = HighsBasisStatus::kNonbasic;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (basis.row_status[iRow] == HighsBasisStatus::kBasic)
      basis.row_status[iRow] = HighsBasisStatus::kNonbasic;
  }
  // Set at most the first num_row variables in basic_index to basic
  const HighsInt use_basic_variables = std::min(num_row, num_basic_variables);
  // num_basic_variables is no longer needed, so can be used as a check
  num_basic_variables = 0;
  for (HighsInt iRow = 0; iRow < use_basic_variables; iRow++) {
    HighsInt iVar = basic_index[iRow];
    if (iVar < num_col) {
      basis.col_status[iVar] = HighsBasisStatus::kBasic;
    } else {
      basis.row_status[iVar - num_col] = HighsBasisStatus::kBasic;
    }
    num_basic_variables++;
  }
  // Complete the assignment of basic variables using the logicals of
  // non-pivotal rows
  const HighsInt num_missing = num_row - num_basic_variables;
  for (HighsInt k = 0; k < num_missing; k++) {
    HighsInt iRow = factor.row_with_no_pivot[rank_deficiency + k];
    basis.row_status[iRow] = HighsBasisStatus::kBasic;
    num_basic_variables++;
  }
  assert(num_basic_variables == num_row);
}